

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O1

bool __thiscall JSON::JSONScanner::IsJSONNumber(JSONScanner *this)

{
  char16 cVar1;
  char16 *pcVar2;
  bool bVar3;
  char16 *pcVar4;
  bool bVar5;
  bool bVar6;
  
  bVar6 = *this->currentChar == L'0';
  if (bVar6) {
    this->currentChar = this->currentChar + 1;
  }
  pcVar2 = this->currentChar;
  while( true ) {
    bVar3 = bVar6;
    pcVar4 = pcVar2 + 1;
    bVar5 = this->inputText + this->inputLen <= pcVar2;
    if (bVar5) {
      return bVar5;
    }
    this->currentChar = pcVar2 + 1;
    cVar1 = *pcVar2;
    if (9 < (ushort)cVar1 - 0x30) break;
    pcVar2 = pcVar4;
    bVar6 = false;
    if (bVar3) {
      return bVar5;
    }
  }
  if (cVar1 == L'\0') {
    return bVar5;
  }
  if (cVar1 == L'.') {
    if (pcVar4 < this->inputText + this->inputLen) {
      this->currentChar = pcVar2 + 2;
      return (ushort)(*pcVar4 + L'￐') < 10;
    }
    return false;
  }
  return true;
}

Assistant:

bool JSONScanner::IsJSONNumber()
    {
        bool firstDigitIsAZero = false;
        if (PeekNextChar() == '0')
        {
            firstDigitIsAZero = true;
            currentChar++;
        }

        //partial verification of number JSON grammar.
        while (currentChar < inputText + inputLen)
        {
            switch(ReadNextChar())
            {
            case 0:
                return false;
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                if (firstDigitIsAZero)
                {
                    return false;
                }
                break;

            case '.':
                {
                    // at least one digit after '.'
                    if(currentChar < inputText + inputLen)
                    {
                        char16 nch = ReadNextChar();
                        if('0' <= nch && nch <= '9')
                        {
                            return true;
                        }
                        else
                        {
                            return false;
                        }
                    }
                    else
                    {
                        return false;
                    }
                }
                //case 'E':
                //case 'e':
                //    return true;
            default:
                return true;
            }

            firstDigitIsAZero = false;
        }
        return true;
    }